

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O1

ChQuaternion<double> *
chrono::Q_from_AngX(ChQuaternion<double> *__return_storage_ptr__,double angleX)

{
  ChQuaternion<double> *quat;
  double dVar1;
  double dVar2;
  
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  dVar1 = sin(angleX * 0.5);
  dVar2 = cos(angleX * 0.5);
  __return_storage_ptr__->m_data[0] = dVar2;
  __return_storage_ptr__->m_data[1] = dVar1 * VECT_X;
  __return_storage_ptr__->m_data[2] = dVar1 * DAT_00b90ad8;
  __return_storage_ptr__->m_data[3] = dVar1 * DAT_00b90ae0;
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> Q_from_AngX(double angleX) {
    return Q_from_AngAxis(angleX, VECT_X);
}